

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_decoder.h
# Opt level: O1

bool __thiscall
draco::DynamicIntegerPointsKdTreeDecoder<1>::
DecodeInternal<draco::ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>>,draco::Converter>>
          (DynamicIntegerPointsKdTreeDecoder<1> *this,uint32_t num_points,
          ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
          *oit)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar1;
  int *piVar2;
  pointer pvVar3;
  ulong *puVar4;
  pointer puVar5;
  pointer puVar6;
  uint *puVar7;
  bool bVar8;
  byte bVar9;
  uint uVar10;
  uint32_t uVar11;
  _Elt_pointer pDVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  pointer pvVar20;
  uint uVar21;
  ulong uVar22;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *pCVar23;
  bool bVar24;
  uint32_t number;
  DecodingStatus init_status;
  stack<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>_>
  status_stack;
  bool local_e5;
  DecodingStatus local_e0;
  long local_d0;
  ulong local_c8;
  uint32_t local_bc;
  ConversionOutputIterator<std::back_insert_iterator<std::vector<draco::VectorD<unsigned_int,_3>,_std::allocator<draco::VectorD<unsigned_int,_3>_>_>_>,_draco::Converter>
  *local_b8;
  DecodingStatus local_ac;
  ulong local_a0;
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
  local_98;
  ulong local_48;
  DirectBitDecoder *local_40;
  DirectBitDecoder *local_38;
  
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
             (ulong)this->dimension_,&local_e0.num_remaining_points,(allocator_type *)&local_ac);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->base_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start,&local_98);
  if (local_98._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_98._M_impl.super__Deque_impl_data._M_map,
                    (long)local_98._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_98._M_impl.super__Deque_impl_data._M_map);
  }
  local_e0._0_8_ = local_e0._0_8_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_98,
             (ulong)this->dimension_,&local_e0.num_remaining_points,(allocator_type *)&local_ac);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            ((this->levels_stack_).
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  if (local_98._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0) {
    operator_delete(local_98._M_impl.super__Deque_impl_data._M_map,
                    (long)local_98._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_98._M_impl.super__Deque_impl_data._M_map);
  }
  local_ac.last_axis = 0;
  local_ac.stack_pos = 0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_98._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_ac.num_remaining_points = num_points;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
  ::_M_initialize_map(&local_98,0);
  if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_98._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>>
    ::_M_push_back_aux<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus_const&>
              ((deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>>
                *)&local_98,&local_ac);
  }
  else {
    (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos = local_ac.stack_pos;
    (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_ac.num_remaining_points;
    (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_ac.last_axis;
    local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  local_e5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
             local_98._M_impl.super__Deque_impl_data._M_start._M_cur;
  if (!local_e5) {
    local_40 = &this->numbers_decoder_;
    local_38 = &this->remaining_bits_decoder_;
    local_b8 = oit;
    do {
      pDVar12 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pDVar12 = local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x2a;
      }
      uVar16 = pDVar12[-1].num_remaining_points;
      uVar11 = pDVar12[-1].last_axis;
      uVar10 = pDVar12[-1].stack_pos;
      uVar22 = (ulong)uVar10;
      if (local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_98._M_impl.super__Deque_impl_data._M_finish._M_first) {
        operator_delete(local_98._M_impl.super__Deque_impl_data._M_finish._M_first,0x1f8);
        local_98._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_98._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x2a;
        local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_first + 0x29;
        local_98._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        local_98._M_impl.super__Deque_impl_data._M_finish._M_cur =
             local_98._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
      }
      pCVar23 = local_b8;
      uVar15 = 1;
      if (uVar16 <= num_points) {
        uVar21 = uVar11 + 1;
        if (this->dimension_ - 1 == uVar11) {
          uVar21 = 0;
        }
        if (uVar21 < this->dimension_) {
          pvVar3 = (this->base_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar1 = pvVar3 + uVar22;
          pvVar20 = (this->levels_stack_).
                    super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar22;
          uVar11 = *(uint32_t *)
                    (*(long *)&(pvVar20->
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                               _M_impl.super__Vector_impl_data + (ulong)uVar21 * 4);
          local_c8 = uVar22;
          if (this->bit_length_ == uVar11) {
            uVar15 = 0;
            if (uVar16 != 0) {
              do {
                puVar4 = (ulong *)(pvVar1->
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                  _M_impl.super__Vector_impl_data._M_start;
                local_e0._0_8_ = *puVar4;
                local_e0.stack_pos = (uint32_t)puVar4[1];
                std::
                vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                ::emplace_back<draco::VectorD<unsigned_int,3>>
                          ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                            *)(pCVar23->oit_).container,(VectorD<unsigned_int,_3> *)&local_e0);
                this->num_decoded_points_ = this->num_decoded_points_ + 1;
                uVar16 = uVar16 - 1;
              } while (uVar16 != 0);
              uVar15 = 0;
            }
          }
          else if (uVar16 < 3) {
            puVar5 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start;
            *puVar5 = uVar21;
            uVar14 = (ulong)this->dimension_;
            if (1 < this->dimension_) {
              uVar10 = *puVar5;
              uVar13 = 1;
              do {
                bVar24 = uVar10 == (int)uVar14 - 1U;
                uVar10 = uVar10 + 1;
                if (bVar24) {
                  uVar10 = 0;
                }
                puVar5[uVar13] = uVar10;
                uVar13 = uVar13 + 1;
                uVar14 = (ulong)this->dimension_;
              } while (uVar13 < uVar14);
            }
            if (uVar16 != 0) {
              uVar10 = 0;
              do {
                local_c8 = CONCAT44(local_c8._4_4_,uVar10);
                bVar24 = this->dimension_ != 0;
                uVar15 = 0xd;
                if (bVar24) {
                  uVar22 = 0;
                  do {
                    puVar5 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar6 = (this->axes_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start;
                    puVar5[puVar6[uVar22]] = 0;
                    uVar14 = (ulong)puVar6[uVar22];
                    iVar19 = this->bit_length_ -
                             *(int *)(*(long *)&(pvVar20->
                                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                )._M_impl.super__Vector_impl_data + uVar14 * 4);
                    if ((iVar19 != 0) &&
                       (bVar8 = DirectBitDecoder::DecodeLeastSignificantBits32
                                          (local_38,iVar19,puVar5 + uVar14), !bVar8)) {
                      uVar15 = 1;
                      pCVar23 = local_b8;
                      goto LAB_0015d911;
                    }
                    uVar10 = (this->axes_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[uVar22];
                    puVar7 = (this->p_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + uVar10;
                    *puVar7 = *puVar7 | (pvVar1->
                                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                        )._M_impl.super__Vector_impl_data._M_start[uVar10];
                    uVar22 = uVar22 + 1;
                    bVar24 = uVar22 < this->dimension_;
                  } while (bVar24);
                  uVar15 = 0xd;
                  pCVar23 = local_b8;
                }
LAB_0015d911:
                if (bVar24) goto LAB_0015d952;
                puVar4 = (ulong *)(this->p_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start;
                local_e0._0_8_ = *puVar4;
                local_e0.stack_pos = (uint32_t)puVar4[1];
                std::
                vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                ::emplace_back<draco::VectorD<unsigned_int,3>>
                          ((vector<draco::VectorD<unsigned_int,3>,std::allocator<draco::VectorD<unsigned_int,3>>>
                            *)(pCVar23->oit_).container,(VectorD<unsigned_int,_3> *)&local_e0);
                this->num_decoded_points_ = this->num_decoded_points_ + 1;
                uVar10 = (int)local_c8 + 1;
              } while (uVar10 != uVar16);
            }
            uVar15 = 10;
LAB_0015d952:
            if (uVar15 == 10) {
              uVar15 = 0;
            }
          }
          else if (this->num_decoded_points_ <= this->num_points_) {
            local_d0 = CONCAT44(local_d0._4_4_,this->bit_length_);
            uVar22 = (ulong)(uVar10 + 1);
            local_a0 = (ulong)uVar21;
            local_48 = uVar22;
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                      (pvVar3 + uVar22,pvVar1);
            piVar2 = (int *)(*(long *)&(this->base_stack_).
                                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start[uVar22].
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data + local_a0 * 4);
            *piVar2 = *piVar2 + (1 << ((char)local_d0 + ~(byte)uVar11 & 0x1f));
            uVar15 = 1;
            iVar19 = 0x1f;
            if (uVar16 != 0) {
              for (; uVar16 >> iVar19 == 0; iVar19 = iVar19 + -1) {
              }
            }
            local_bc = 0;
            local_d0 = uVar22 * 3;
            DirectBitDecoder::DecodeLeastSignificantBits32(local_40,iVar19,&local_bc);
            iVar19 = (uVar16 >> 1) - local_bc;
            if (local_bc <= uVar16 >> 1) {
              iVar17 = uVar16 - iVar19;
              iVar18 = iVar19;
              if (iVar19 != iVar17) {
                puVar7 = (this->half_decoder_).pos_._M_current;
                if (puVar7 == (this->half_decoder_).bits_.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_finish) {
                  bVar9 = 0;
                }
                else {
                  uVar11 = (this->half_decoder_).num_used_bits_;
                  bVar9 = (byte)((*puVar7 << ((byte)uVar11 & 0x1f)) >> 0x1f);
                  uVar11 = uVar11 + 1;
                  (this->half_decoder_).num_used_bits_ = uVar11;
                  if (uVar11 == 0x20) {
                    (this->half_decoder_).pos_._M_current = puVar7 + 1;
                    (this->half_decoder_).num_used_bits_ = 0;
                  }
                }
                if (bVar9 == 0) {
                  iVar18 = iVar17;
                  iVar17 = iVar19;
                }
              }
              pvVar3 = (this->levels_stack_).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              pvVar1 = pvVar3 + local_c8;
              puVar5 = (pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                       _M_impl.super__Vector_impl_data._M_start + local_a0;
              *puVar5 = *puVar5 + 1;
              std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         ((long)&(pvVar3->
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                                 _M_impl.super__Vector_impl_data + local_d0 * 8),pvVar1);
              if (iVar18 != 0) {
                local_e0.last_axis = uVar21;
                local_e0.num_remaining_points = iVar18;
                local_e0.stack_pos = (uint32_t)local_c8;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                            *)&local_98,&local_e0);
              }
              uVar15 = 0;
              if (iVar17 != 0) {
                local_e0.last_axis = uVar21;
                local_e0.num_remaining_points = iVar17;
                local_e0.stack_pos = (uint32_t)local_48;
                std::
                deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                ::emplace_back<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>
                          ((deque<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
                            *)&local_98,&local_e0);
              }
            }
          }
        }
      }
    } while (((uVar15 & 0xd) == 0) &&
            (local_e5 = local_98._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                        local_98._M_impl.super__Deque_impl_data._M_start._M_cur, !local_e5));
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus,_std::allocator<draco::DynamicIntegerPointsKdTreeDecoder<1>::DecodingStatus>_>
  ::~_Deque_base(&local_98);
  return local_e5;
}

Assistant:

bool DynamicIntegerPointsKdTreeDecoder<compression_level_t>::DecodeInternal(
    uint32_t num_points, OutputIteratorT &oit) {
  typedef DecodingStatus Status;
  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  DecodingStatus init_status(num_points, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    const DecodingStatus status = status_stack.top();
    status_stack.pop();

    const uint32_t num_remaining_points = status.num_remaining_points;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    if (num_remaining_points > num_points) {
      return false;
    }

    const uint32_t axis = GetAxis(num_remaining_points, levels, last_axis);
    if (axis >= dimension_) {
      return false;
    }

    const uint32_t level = levels[axis];

    // All axes have been fully subdivided, just output points.
    if ((bit_length_ - level) == 0) {
      for (uint32_t i = 0; i < num_remaining_points; i++) {
        *oit = old_base;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    DRACO_DCHECK_EQ(true, num_remaining_points != 0);

    // Fast decoding of remaining bits if number of points is 1 or 2.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        for (uint32_t j = 0; j < dimension_; j++) {
          p_[axes_[j]] = 0;
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            if (!remaining_bits_decoder_.DecodeLeastSignificantBits32(
                    num_remaining_bits, &p_[axes_[j]])) {
              return false;
            }
          }
          p_[axes_[j]] = old_base[axes_[j]] | p_[axes_[j]];
        }
        *oit = p_;
        ++oit;
        ++num_decoded_points_;
      }
      continue;
    }

    if (num_decoded_points_ > num_points_) {
      return false;
    }

    const int num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;         // copy
    base_stack_[stack_pos + 1][axis] += modifier;  // new base

    const int incoming_bits = MostSignificantBit(num_remaining_points);

    uint32_t number = 0;
    DecodeNumber(incoming_bits, &number);

    uint32_t first_half = num_remaining_points / 2;
    if (first_half < number) {
      // Invalid |number|.
      return false;
    }
    first_half -= number;
    uint32_t second_half = num_remaining_points - first_half;

    if (first_half != second_half) {
      if (!half_decoder_.DecodeNextBit()) {
        std::swap(first_half, second_half);
      }
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (first_half) {
      status_stack.push(DecodingStatus(first_half, axis, stack_pos));
    }
    if (second_half) {
      status_stack.push(DecodingStatus(second_half, axis, stack_pos + 1));
    }
  }
  return true;
}